

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcColumnType::~IfcColumnType(IfcColumnType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x90de58;
  *(undefined8 *)&this->field_0x1c0 = 0x90df70;
  *(undefined8 *)&this->field_0x88 = 0x90de80;
  *(undefined8 *)&this->field_0x98 = 0x90dea8;
  *(undefined8 *)&this->field_0xf0 = 0x90ded0;
  *(undefined8 *)&this->field_0x148 = 0x90def8;
  *(undefined8 *)&this->field_0x180 = 0x90df20;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x90df48;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColumnType,_1UL>).field_0x20)
  {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x90e238;
  *(undefined8 *)&this->field_0x1c0 = 0x90e300;
  *(undefined8 *)&this->field_0x88 = 0x90e260;
  *(undefined8 *)&this->field_0x98 = 0x90e288;
  *(undefined8 *)&this->field_0xf0 = 0x90e2b0;
  *(undefined8 *)&this->field_0x148 = 0x90e2d8;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__0090df98);
  operator_delete(this);
  return;
}

Assistant:

IfcColumnType() : Object("IfcColumnType") {}